

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  Arena *arena_local;
  string *value_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  if ((arena == (Arena *)0x0) && (this->ptr_ != default_value)) {
    Destroy(this,default_value,(Arena *)0x0);
  }
  if (value == (string *)0x0) {
    this->ptr_ = default_value;
  }
  else {
    this->ptr_ = value;
    if (arena != (Arena *)0x0) {
      Arena::Own<std::__cxx11::string>(arena,value);
    }
  }
  return;
}

Assistant:

inline void SetAllocated(const ::std::string* default_value,
                           ::std::string* value, ::google::protobuf::Arena* arena) {
    if (arena == NULL && ptr_ != default_value) {
      Destroy(default_value, arena);
    }
    if (value != NULL) {
      ptr_ = value;
      if (arena != NULL) {
        arena->Own(value);
      }
    } else {
      ptr_ = const_cast< ::std::string* >(default_value);
    }
  }